

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O1

xr_reader * __thiscall
xray_re::xr_reader::open_chunk_next(xr_reader *this,uint32_t *_id,xr_reader *prev)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint8_t *puVar3;
  xr_reader *pxVar4;
  _lzhuf *this_00;
  uint32_t *puVar5;
  ulong _codesize;
  uint8_t *data;
  size_t real_size;
  uint8_t *local_30;
  size_t local_28;
  
  if (prev == (xr_reader *)0x0) {
    this->m_next = this->m_data;
  }
  else {
    (*prev->_vptr_xr_reader[1])(prev);
  }
  puVar2 = (uint32_t *)this->m_end;
  puVar5 = (uint32_t *)this->m_next;
  if (puVar5 < puVar2) {
    if (puVar2 < puVar5 + 2) {
      __assert_fail("m_next + 8 <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x4a,"xr_reader *xray_re::xr_reader::open_chunk_next(uint32_t &, xr_reader *)")
      ;
    }
    (this->field_2).m_p = (uint8_t *)(puVar5 + 1);
    uVar1 = *puVar5;
    (this->field_2).m_p = (uint8_t *)(puVar5 + 2);
    _codesize = (ulong)puVar5[1];
    puVar5 = (uint32_t *)((long)puVar5 + _codesize + 8);
    if (puVar2 < puVar5) {
      __assert_fail("m_p + size <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x4e,"xr_reader *xray_re::xr_reader::open_chunk_next(uint32_t &, xr_reader *)")
      ;
    }
    this->m_next = (uint8_t *)puVar5;
    *_id = uVar1;
    if ((int)uVar1 < 0) {
      puVar3 = (this->field_2).m_p;
      this_00 = &xr_lzhuf::instance()->m_lzhuf;
      _lzhuf::Decode(this_00,&local_30,&local_28,puVar3,_codesize);
      pxVar4 = (xr_reader *)operator_new(0x28);
      pxVar4->m_data = local_30;
      (pxVar4->field_2).m_p = local_30;
      pxVar4->m_next = local_30;
      pxVar4->m_end = local_30 + local_28;
      pxVar4->_vptr_xr_reader = (_func_int **)&PTR__xr_temp_reader_00249850;
    }
    else {
      pxVar4 = (xr_reader *)operator_new(0x28);
      puVar3 = (this->field_2).m_p;
      pxVar4->_vptr_xr_reader = (_func_int **)&PTR__xr_reader_00249830;
      pxVar4->m_data = puVar3;
      (pxVar4->field_2).m_p = puVar3;
      pxVar4->m_next = puVar3;
      pxVar4->m_end = puVar3 + _codesize;
    }
  }
  else {
    pxVar4 = (xr_reader *)0x0;
  }
  return pxVar4;
}

Assistant:

xr_reader* xr_reader::open_chunk_next(uint32_t& _id, xr_reader* prev)
{
	if (prev)
		delete prev;
	else
		m_next = m_data;
	if (m_next < m_end) {
		assert(m_next + 8 <= m_end);
		m_p = m_next;
		uint32_t id = r_u32();
		uint32_t size = r_u32();
		assert(m_p + size <= m_end);
		m_next = m_p + size;
		_id = id;
		if (id & CHUNK_COMPRESSED) {
			size_t real_size;
			uint8_t* data;
			xr_lzhuf::decompress(data, real_size, m_p, size);
			return new xr_temp_reader(data, real_size);
		} else {
			return new xr_reader(m_p, size);
		}
	}
	return 0;
}